

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void sysbvm_context_setIntrinsicTypeMetadata
               (sysbvm_context_t *context,sysbvm_tuple_t type,char *name,sysbvm_tuple_t supertype,
               ...)

{
  char in_AL;
  uint uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  long *plVar5;
  ulong uVar6;
  uint uVar7;
  long *plVar8;
  size_t i;
  size_t localIndex;
  sysbvm_tuple_t *psVar9;
  undefined8 in_R8;
  sysbvm_tuple_t type_00;
  undefined8 in_R9;
  long lVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sysbvm_tuple_t *local_110;
  size_t local_f8;
  sysbvm_tuple_t local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar2 = sysbvm_symbol_internWithCString(context,name);
  if (supertype != 0) {
    sysbvm_type_setSupertype(type,supertype);
  }
  sysbvm_namespace_setNewSymbolBindingWithValue(context,(context->roots).globalNamespace,sVar2,type)
  ;
  sysbvm_orderedCollection_add(context,(context->roots).intrinsicTypes,type);
  uVar1 = 0x20;
  lVar10 = 0;
  plVar8 = (long *)&stack0x00000008;
  do {
    if (uVar1 < 0x29) {
      uVar6 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      plVar5 = plVar8;
      plVar8 = (long *)((long)local_e8 + uVar6);
    }
    else {
      plVar5 = plVar8 + 1;
    }
    if (*plVar8 == 0) {
      sVar2 = sysbvm_type_getSupertype(type);
      if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
        local_f8 = sysbvm_type_getTotalSlotCount(sVar2);
      }
      else {
        local_f8 = 0;
      }
      sVar2 = sysbvm_array_create(context,-lVar10);
      uVar1 = 0x20;
      local_110 = (sysbvm_tuple_t *)&stack0x00000008;
      for (localIndex = 0; -localIndex != lVar10; localIndex = localIndex + 1) {
        uVar6 = (ulong)uVar1;
        if (uVar6 < 0x29) {
          uVar1 = uVar1 + 8;
          psVar3 = (sysbvm_tuple_t *)((long)local_e8 + uVar6);
        }
        else {
          psVar3 = local_110;
          local_110 = local_110 + 1;
        }
        sVar4 = sysbvm_symbol_internWithCString(context,(char *)*psVar3);
        uVar6 = (ulong)uVar1;
        if (uVar6 < 0x29) {
          psVar3 = (sysbvm_tuple_t *)((long)local_e8 + uVar6);
          uVar1 = uVar1 + 8;
          uVar6 = (ulong)uVar1;
        }
        else {
          psVar3 = local_110;
          local_110 = local_110 + 1;
        }
        if ((uint)uVar6 < 0x29) {
          uVar1 = (uint)uVar6 + 8;
          psVar9 = (sysbvm_tuple_t *)((long)local_e8 + uVar6);
        }
        else {
          psVar9 = local_110;
          local_110 = local_110 + 1;
        }
        type_00 = *psVar9;
        if (type_00 == 0) {
          type_00 = (context->roots).anyValueType;
        }
        sVar4 = sysbvm_typeSlot_create
                          (context,type,sVar4,(long)(int)*psVar3 << 4 | 0xb,type_00,localIndex,
                           local_f8 + localIndex);
        if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
          *(sysbvm_tuple_t *)(sVar2 + 0x10 + localIndex * 8) = sVar4;
        }
      }
      if ((type & 0xf) == 0 && type != 0) {
        *(sysbvm_tuple_t *)(type + 0x38) = sVar2;
      }
      sysbvm_type_setTotalSlotCount(context,type,local_f8 - lVar10);
      sysbvm_type_buildSlotDictionary(context,type);
      return;
    }
    if (uVar1 < 0x29) {
      uVar7 = uVar1 + 8;
      if (0x20 < uVar1) goto LAB_001124ea;
      uVar1 = uVar1 + 0x10;
    }
    else {
      plVar5 = plVar5 + 1;
      uVar7 = uVar1;
LAB_001124ea:
      plVar5 = plVar5 + 1;
      uVar1 = uVar7;
    }
    lVar10 = lVar10 + -1;
    plVar8 = plVar5;
  } while( true );
}

Assistant:

static void sysbvm_context_setIntrinsicTypeMetadata(sysbvm_context_t *context, sysbvm_tuple_t type, const char *name, sysbvm_tuple_t supertype, ...)
{
    sysbvm_tuple_t nameSymbol = sysbvm_symbol_internWithCString(context, name);
    if(supertype)
        sysbvm_type_setSupertype(type, supertype);
    sysbvm_namespace_setNewSymbolBindingWithValue(context, context->roots.globalNamespace, nameSymbol, type);
    sysbvm_orderedCollection_add(context, context->roots.intrinsicTypes, type);

    // First pass: count the arguments.
    size_t slotNameCount = 0;
    va_list valist;
    va_start(valist, supertype);
    while(va_arg(valist, const char *))
    {
        va_arg(valist, sysbvm_typeSlotFlags_t);
        va_arg(valist, int);
        ++slotNameCount;
    }
    va_end(valist);

    // Second pass: make the argument list.
    size_t supertypeTotalSlotCount = 0;
    sysbvm_tuple_t actualSupertype = sysbvm_type_getSupertype(type);
    if(sysbvm_tuple_isNonNullPointer(actualSupertype))
        supertypeTotalSlotCount = sysbvm_type_getTotalSlotCount(actualSupertype);

    sysbvm_tuple_t slots = sysbvm_array_create(context, slotNameCount);
    va_start(valist, supertype);
    for(size_t i = 0; i < slotNameCount; ++i)
    {
        sysbvm_tuple_t slotName = sysbvm_symbol_internWithCString(context, va_arg(valist, const char *));
        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(va_arg(valist, int));
        sysbvm_tuple_t slotType = va_arg(valist, sysbvm_tuple_t);
        if(!slotType)
            slotType = context->roots.anyValueType;
        sysbvm_array_atPut(slots, i, sysbvm_typeSlot_create(context, type, slotName, flags, slotType, i, supertypeTotalSlotCount + i));
    }

    va_end(valist);
    sysbvm_type_setSlots(type, slots);
    sysbvm_type_setTotalSlotCount(context, type, supertypeTotalSlotCount + slotNameCount);
    sysbvm_type_buildSlotDictionary(context, type);
}